

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_sub(sexp ctx,sexp a,sexp b)

{
  sexp_tag_t sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  sexp a_00;
  sexp psVar5;
  sexp psVar6;
  double dVar7;
  sexp local_60;
  double local_58;
  sexp tmp2;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  iVar3 = sexp_number_type(a);
  iVar4 = sexp_number_type(b);
  a_00 = (sexp)&DAT_0000043e;
  local_48.var = &local_60;
  local_60 = (sexp)&DAT_0000043e;
  local_38.var = &tmp2;
  tmp2 = (sexp)&DAT_0000043e;
  local_38.next = &local_48;
  local_48.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_38;
  bVar2 = true;
  psVar6 = a;
  psVar5 = b;
  switch(iVar3 * 6 + iVar4) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
    b = a;
    goto LAB_00119959;
  case 6:
  case 0xc:
  case 0x12:
  case 0x18:
  case 0x1e:
LAB_00119959:
    a_00 = sexp_type_exception(ctx,(sexp)0x0,3,b);
    goto switchD_0011993f_default;
  case 7:
    a_00 = (sexp)((long)a + (1 - (long)b));
    goto switchD_0011993f_default;
  case 8:
    if (a != (sexp)&DAT_00000001) {
      dVar7 = (double)((long)a >> 1);
      goto LAB_00119bf1;
    }
    dVar7 = -(double)(b->value).stack.length;
    break;
  case 9:
    local_60 = sexp_fixnum_to_bignum(ctx,a);
    psVar5 = sexp_bignum_sub(ctx,(sexp)0x0,b,local_60);
    if ((((ulong)psVar5 & 3) == 0) && (psVar5->tag == 0xc)) {
      (psVar5->value).flonum_bits[0] = -(psVar5->value).flonum_bits[0];
    }
    else if (((ulong)psVar5 & 1) != 0) {
      psVar5 = (sexp)(1 - ((ulong)psVar5 & 0xfffffffffffffffe));
    }
    goto LAB_00119b9a;
  case 10:
  case 0x16:
    b = a;
    goto LAB_00119975;
  case 0xb:
  case 0x11:
  case 0x17:
    goto switchD_0011993f_caseD_b;
  case 0xd:
    dVar7 = (a->value).flonum - (double)((long)b >> 1);
    break;
  case 0xe:
    dVar7 = (a->value).flonum;
    goto LAB_00119bf1;
  case 0xf:
    local_58 = (a->value).flonum;
    dVar7 = sexp_bignum_to_double(b);
    goto LAB_00119bbb;
  case 0x10:
    local_58 = (a->value).flonum;
    dVar7 = sexp_ratio_to_double(ctx,b);
LAB_00119bbb:
    dVar7 = local_58 - dVar7;
    break;
  case 0x13:
    b = sexp_fixnum_to_bignum(ctx,b);
    local_60 = b;
    goto LAB_00119b95;
  case 0x14:
    dVar7 = sexp_bignum_to_double(a);
    goto LAB_00119bf1;
  case 0x15:
LAB_00119b95:
    psVar5 = sexp_bignum_sub(ctx,(sexp)0x0,a,b);
LAB_00119b9a:
    a_00 = sexp_bignum_normalize(psVar5);
    goto switchD_0011993f_default;
  case 0x19:
  case 0x1b:
    bVar2 = false;
    psVar5 = a;
    local_60 = a;
LAB_00119975:
    a = sexp_make_ratio(ctx,b,(sexp)&DAT_00000003);
    local_60 = a;
switchD_0011993f_caseD_1c:
    tmp2 = sexp_make_ratio(ctx,(psVar5->value).type.name,(psVar5->value).type.cpl);
    psVar5 = (tmp2->value).type.name;
    if ((((ulong)psVar5 & 3) == 0) && (psVar5->tag == 0xc)) {
      psVar5 = sexp_copy_bignum(ctx,(sexp)0x0,psVar5,0);
      (tmp2->value).type.name = psVar5;
    }
    if ((((ulong)psVar5 & 3) == 0) && (psVar5->tag == 0xc)) {
      (psVar5->value).flonum_bits[0] = -(psVar5->value).flonum_bits[0];
    }
    else if (((ulong)psVar5 & 1) != 0) {
      (tmp2->value).type.name = (sexp)(1 - ((ulong)psVar5 & 0xfffffffffffffffe));
    }
    a_00 = sexp_ratio_add(ctx,a,tmp2);
    if (bVar2) goto switchD_0011993f_default;
    if (((ulong)a_00 & 3) == 0) {
      sVar1 = a_00->tag;
      if (sVar1 == 0xb) goto switchD_00119ac8_caseD_b;
      if (sVar1 == 0xc) goto switchD_00119ac8_caseD_c;
      if (sVar1 != 0xd) goto switchD_00119ac8_default;
      goto switchD_00119ac8_caseD_d;
    }
    goto switchD_00119ac8_default;
  case 0x1a:
    dVar7 = sexp_ratio_to_double(ctx,a);
LAB_00119bf1:
    dVar7 = dVar7 - (b->value).flonum;
    break;
  case 0x1c:
    goto switchD_0011993f_caseD_1c;
  case 0x1d:
    dVar7 = sexp_ratio_to_double(ctx,a);
    a = sexp_make_flonum(ctx,dVar7);
    local_60 = a;
  case 0x23:
switchD_0011993f_caseD_23:
    a_00 = sexp_complex_sub(ctx,a,b);
    if (bVar2) goto switchD_0011993f_default;
    if (((ulong)a_00 & 3) == 0) {
      switch(a_00->tag) {
      case 0xb:
switchD_00119ac8_caseD_b:
        (a_00->value).stack.length = (a_00->value).stack.length ^ 0x8000000000000000;
        break;
      case 0xc:
switchD_00119ac8_caseD_c:
        (a_00->value).flonum_bits[0] = -(a_00->value).flonum_bits[0];
        break;
      case 0xd:
switchD_00119ac8_caseD_d:
        psVar5 = (a_00->value).type.name;
        if ((((ulong)psVar5 & 3) != 0) || (psVar5->tag != 0xc)) {
          if (((ulong)psVar5 & 1) != 0) {
            (a_00->value).type.name = (sexp)(1 - ((ulong)psVar5 & 0xfffffffffffffffe));
          }
          break;
        }
LAB_00119d33:
        (psVar5->value).flonum_bits[0] = -(psVar5->value).flonum_bits[0];
        break;
      case 0xe:
        a_00 = sexp_complex_copy(ctx,a_00);
        psVar5 = (a_00->value).type.name;
        if (((ulong)psVar5 & 3) == 0) {
          sVar1 = psVar5->tag;
          if (sVar1 == 0xb) {
            (psVar5->value).stack.length = (psVar5->value).stack.length ^ 0x8000000000000000;
          }
          else if (sVar1 == 0xc) {
            (psVar5->value).flonum_bits[0] = -(psVar5->value).flonum_bits[0];
          }
          else {
            if (sVar1 != 0xd) goto LAB_00119c82;
            psVar6 = (psVar5->value).type.name;
            if ((((ulong)psVar6 & 3) == 0) && (psVar6->tag == 0xc)) {
              (psVar6->value).flonum_bits[0] = -(psVar6->value).flonum_bits[0];
            }
            else if (((ulong)psVar6 & 1) != 0) {
              (psVar5->value).type.name = (sexp)(1 - ((ulong)psVar6 & 0xfffffffffffffffe));
            }
          }
        }
        else {
LAB_00119c82:
          if (((ulong)psVar5 & 1) != 0) {
            (a_00->value).type.name = (sexp)(1 - ((ulong)psVar5 & 0xfffffffffffffffe));
          }
        }
        psVar5 = (a_00->value).type.cpl;
        if (((ulong)psVar5 & 3) == 0) {
          sVar1 = psVar5->tag;
          if (sVar1 == 0xb) {
            (psVar5->value).stack.length = (psVar5->value).stack.length ^ 0x8000000000000000;
            break;
          }
          if (sVar1 == 0xc) goto LAB_00119d33;
          if (sVar1 == 0xd) {
            psVar6 = (psVar5->value).type.name;
            if ((((ulong)psVar6 & 3) == 0) && (psVar6->tag == 0xc)) {
              (psVar6->value).flonum_bits[0] = -(psVar6->value).flonum_bits[0];
            }
            else if (((ulong)psVar6 & 1) != 0) {
              (psVar5->value).type.name = (sexp)(1 - ((ulong)psVar6 & 0xfffffffffffffffe));
            }
            break;
          }
        }
        if (((ulong)psVar5 & 1) != 0) {
          (a_00->value).type.cpl = (sexp)(1 - ((ulong)psVar5 & 0xfffffffffffffffe));
        }
        break;
      default:
        goto switchD_00119ac8_default;
      }
    }
    else {
switchD_00119ac8_default:
      if (((ulong)a_00 & 1) != 0) {
        a_00 = (sexp)(1 - ((ulong)a_00 & 0xfffffffffffffffe));
      }
    }
    goto switchD_0011993f_default;
  case 0x1f:
  case 0x20:
  case 0x21:
    goto switchD_0011993f_caseD_1f;
  case 0x22:
    dVar7 = sexp_ratio_to_double(ctx,b);
    b = sexp_make_flonum(ctx,dVar7);
    goto switchD_0011993f_caseD_1f;
  default:
    goto switchD_0011993f_default;
  }
  a_00 = sexp_make_flonum(ctx,dVar7);
switchD_0011993f_default:
  (ctx->value).context.saves = local_48.next;
  return a_00;
switchD_0011993f_caseD_1f:
  psVar6 = b;
  bVar2 = false;
  b = a;
  local_60 = a;
switchD_0011993f_caseD_b:
  a = sexp_make_complex(ctx,psVar6,(sexp)&DAT_00000001);
  local_60 = a;
  goto switchD_0011993f_caseD_23;
}

Assistant:

sexp sexp_sub (sexp ctx, sexp a, sexp b) {
#if SEXP_USE_FLONUMS
  int negatep=0;
#endif
  int at=sexp_number_type(a), bt=sexp_number_type(b);
  sexp r=SEXP_VOID;
  sexp_gc_var2(tmp1, tmp2);
  sexp_gc_preserve2(ctx, tmp1, tmp2);
  switch ((at * SEXP_NUM_NUMBER_TYPES) + bt) {
  case SEXP_NUM_NOT_NOT: case SEXP_NUM_NOT_FIX:
  case SEXP_NUM_NOT_FLO: case SEXP_NUM_NOT_BIG:
#if SEXP_USE_RATIOS
  case SEXP_NUM_NOT_RAT:
#endif
#if SEXP_USE_COMPLEX
  case SEXP_NUM_NOT_CPX:
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, a);
    break;
  case SEXP_NUM_FIX_NOT: case SEXP_NUM_FLO_NOT: case SEXP_NUM_BIG_NOT:
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_NOT:
#endif
#if SEXP_USE_COMPLEX
  case SEXP_NUM_CPX_NOT:
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, b);
    break;
  case SEXP_NUM_FIX_FIX:
    r = sexp_fx_sub(a, b);      /* VM catches this case */
    break;
  case SEXP_NUM_FIX_FLO:
    r = sexp_make_flonum(ctx, a==SEXP_ZERO ? -sexp_flonum_value(b) : sexp_fixnum_to_double(a)-sexp_flonum_value(b));
    break;
  case SEXP_NUM_FIX_BIG:
    tmp1 = sexp_fixnum_to_bignum(ctx, a);
    r = sexp_bignum_sub(ctx, NULL, b, tmp1);
    sexp_negate_exact(r);
    r = sexp_bignum_normalize(r);
    break;
  case SEXP_NUM_FLO_FIX:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) - sexp_fixnum_to_double(b));
    break;
  case SEXP_NUM_FLO_FLO:
    r = sexp_fp_sub(ctx, a, b);
    break;
  case SEXP_NUM_FLO_BIG:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) - sexp_bignum_to_double(b));
    break;
  case SEXP_NUM_BIG_FIX:
    tmp1 = sexp_fixnum_to_bignum(ctx, b);
    r = sexp_bignum_normalize(sexp_bignum_sub(ctx, NULL, a, tmp1));
    break;
  case SEXP_NUM_BIG_FLO:
    r = sexp_make_flonum(ctx, sexp_bignum_to_double(a) - sexp_flonum_value(b));
    break;
  case SEXP_NUM_BIG_BIG:
    r = sexp_bignum_normalize(sexp_bignum_sub(ctx, NULL, a, b));
    break;
#if SEXP_USE_RATIOS
  case SEXP_NUM_FLO_RAT:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) - sexp_ratio_to_double(ctx, b));
    break;
  case SEXP_NUM_RAT_FLO:
    r = sexp_make_flonum(ctx, sexp_ratio_to_double(ctx, a) - sexp_flonum_value(b));
    break;
  case SEXP_NUM_RAT_FIX:
  case SEXP_NUM_RAT_BIG:
    tmp1 = a; a = b; b = tmp1;
    negatep = 1;
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_FIX_RAT:
  case SEXP_NUM_BIG_RAT:
    a = tmp1 = sexp_make_ratio(ctx, a, SEXP_ONE);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_RAT_RAT:
    tmp2 = sexp_make_ratio(ctx, sexp_ratio_numerator(b), sexp_ratio_denominator(b));
    if (sexp_bignump(sexp_ratio_numerator(tmp2)))
      sexp_ratio_numerator(tmp2) = sexp_copy_bignum(ctx, NULL, sexp_ratio_numerator(tmp2), 0);
    sexp_negate_exact(sexp_ratio_numerator(tmp2));
    r = sexp_ratio_add(ctx, a, tmp2);
    if (negatep) {
      sexp_negate_maybe_ratio(r);
    }
    break;
#endif
#if SEXP_USE_COMPLEX
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_CPX:
    a = tmp1 = sexp_make_flonum(ctx, sexp_ratio_to_double(ctx, a));
    goto complex_sub;
  case SEXP_NUM_CPX_RAT:
    b = tmp1 = sexp_make_flonum(ctx, sexp_ratio_to_double(ctx, b));
    /* ... FALLTHROUGH ... */
#endif
  case SEXP_NUM_CPX_FLO:
  case SEXP_NUM_CPX_FIX:
  case SEXP_NUM_CPX_BIG:
    tmp1 = a; a = b; b = tmp1;
    negatep = 1;
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_FLO_CPX:
  case SEXP_NUM_FIX_CPX:
  case SEXP_NUM_BIG_CPX:
    a = tmp1 = sexp_make_complex(ctx, a, SEXP_ZERO);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_CPX_CPX:
#if SEXP_USE_RATIOS
  complex_sub:
#endif
    r = sexp_complex_sub(ctx, a, b);
    if (negatep) {
      if (sexp_complexp(r)) {
        r = sexp_complex_copy(ctx, r);
        sexp_negate_maybe_ratio(sexp_complex_real(r));
        sexp_negate_maybe_ratio(sexp_complex_imag(r));
      } else {
        sexp_negate_maybe_ratio(r);
      }
    }
    break;
#endif
  }
  sexp_gc_release2(ctx);
  return r;
}